

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

bool __thiscall QUrlQuery::hasQueryItem(QUrlQuery *this,QString *key)

{
  QUrlQueryPrivate *pQVar1;
  const_iterator cVar2;
  bool bVar3;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QUrlQueryPrivate *)0x0) {
    bVar3 = false;
  }
  else {
    cVar2 = QUrlQueryPrivate::findKey(pQVar1,key);
    pQVar1 = (this->d).d.ptr;
    bVar3 = cVar2.i != (pQVar1->itemList).d.ptr + (pQVar1->itemList).d.size;
  }
  return bVar3;
}

Assistant:

bool QUrlQuery::hasQueryItem(const QString &key) const
{
    if (!d)
        return false;
    return d->findKey(key) != d->itemList.constEnd();
}